

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O1

bool __thiscall dg::pta::PointerIdPointsToSet::add(PointerIdPointsToSet *this,Pointer *ptr)

{
  type tVar1;
  bool bVar2;
  IDTy IVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  unsigned_long sft;
  Pointer local_28;
  
  tVar1 = Offset::UNKNOWN;
  local_28.target = ptr->target;
  local_28.offset.offset = Offset::UNKNOWN;
  IVar3 = PointerIDLookupTable::getOrCreate((PointerIDLookupTable *)&lookupTable,&local_28);
  bVar2 = ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::get(&this->pointers,IVar3);
  if (bVar2) {
    bVar2 = false;
  }
  else if ((ptr->offset).offset == tVar1) {
    bVar2 = addWithUnknownOffset(this,ptr->target);
  }
  else {
    IVar3 = PointerIDLookupTable::getOrCreate((PointerIDLookupTable *)&lookupTable,ptr);
    local_28.target = (PSNode *)(IVar3 & 0xffffffffffffffc0);
    pmVar4 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,(key_type *)&local_28);
    uVar5 = (ulong)(uint)((int)IVar3 - (int)local_28.target);
    bVar2 = (*pmVar4 >> (uVar5 & 0x3f) & 1) == 0;
    *pmVar4 = *pmVar4 | 1L << (uVar5 & 0x3f);
  }
  return bVar2;
}

Assistant:

bool add(const Pointer &ptr) {
        if (has({ptr.target, Offset::UNKNOWN})) {
            return false;
        }
        if (ptr.offset.isUnknown()) {
            return addWithUnknownOffset(ptr.target);
        }
        return !pointers.set(getPointerID(ptr));
    }